

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O0

int64_t __thiscall aeron::DriverProxy::removeSubscription(DriverProxy *this,int64_t registrationId)

{
  int64_t iVar1;
  int64_t correlationId;
  anon_class_24_3_80c13eea *in_stack_000002b8;
  DriverProxy *in_stack_000002c0;
  
  iVar1 = concurrent::ringbuffer::ManyToOneRingBuffer::nextCorrelationId
                    ((ManyToOneRingBuffer *)0x1fdf4f);
  writeCommandToDriver<aeron::DriverProxy::removeSubscription(long)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (in_stack_000002c0,in_stack_000002b8);
  return iVar1;
}

Assistant:

std::int64_t removeSubscription(std::int64_t registrationId)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            RemoveMessageFlyweight removeMessage(buffer, 0);

            removeMessage.clientId(m_clientId);
            removeMessage.correlationId(correlationId);
            removeMessage.registrationId(registrationId);

            length = removeMessage.length();

            return ControlProtocolEvents::REMOVE_SUBSCRIPTION;
        });
        return correlationId;
    }